

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O3

void __thiscall
Assimp::STEP::LazyObject::LazyObject
          (LazyObject *this,DB *db,uint64_t id,uint64_t param_3,char *type,char *args)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  _Base_ptr p_Var3;
  long lVar4;
  _Base_ptr p_Var5;
  long lVar6;
  char *pcVar7;
  char *tmp;
  pair<unsigned_long,_unsigned_long> local_38;
  
  this->id = id;
  this->type = type;
  this->db = db;
  this->args = args;
  this->obj = (Object *)0x0;
  p_Var3 = (db->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(db->inv_whitelist)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (*(char **)(p_Var3 + 1) >= type) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(char **)(p_Var3 + 1) < type];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(char **)(p_Var5 + 1) <= type)) {
      lVar6 = 0;
      do {
        cVar2 = *args;
        pcVar7 = args;
        if (cVar2 == '(') {
          lVar4 = 1;
LAB_006f88c4:
          lVar6 = lVar6 + lVar4;
        }
        else {
          if (cVar2 == ')') {
            lVar4 = -1;
            goto LAB_006f88c4;
          }
          if (cVar2 == '\0') {
            return;
          }
          if ((cVar2 == '#' && 0 < lVar6) && (pcVar7 = args + 1, args[1] != '#')) {
            local_38.first = strtoul10_64(pcVar7,(char **)&local_38,(uint *)0x0);
            local_38.second = id;
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
            ::_M_emplace_equal<std::pair<unsigned_long,unsigned_long>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                        *)&db->refs,&local_38);
            pcVar7 = args;
          }
        }
        args = pcVar7 + 1;
      } while( true );
    }
  }
  return;
}

Assistant:

STEP::LazyObject::LazyObject(DB& db, uint64_t id,uint64_t /*line*/, const char* const type,const char* args)
: id(id)
, type(type)
, db(db)
, args(args)
, obj() {
    // find any external references and store them in the database.
    // this helps us emulate STEPs INVERSE fields.
    if (!db.KeepInverseIndicesForType(type)) {
        return;
    }

    // do a quick scan through the argument tuple and watch out for entity references
    const char *a( args );
    int64_t skip_depth( 0 );
    while ( *a ) {
        handleSkippedDepthFromToken(a, skip_depth);
        /*if (*a == '(') {
            ++skip_depth;
        } else if (*a == ')') {
            --skip_depth;
        }*/

		if (skip_depth >= 1 && *a=='#') {
			if (*(a + 1) != '#') {
				/*const char *tmp;
				const int64_t num = static_cast<int64_t>(strtoul10_64(a + 1, &tmp));
				db.MarkRef(num, id);*/
                db.MarkRef(getIdFromToken(a), id);
			} else {
				++a;
			}
        }
        ++a;
    }
}